

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.h
# Opt level: O0

void find_predictors(AV1_COMP *cpi,MACROBLOCK *x,MV_REFERENCE_FRAME ref_frame,int_mv (*frame_mv) [8]
                    ,buf_2d (*yv12_mb) [3],BLOCK_SIZE bsize,int force_skip_low_temp_var,
                    int skip_pred_mv,_Bool *use_scaled_ref_frame)

{
  int16_t *piVar1;
  int iVar2;
  int_mv *ref_y_buffer;
  int_mv *piVar3;
  long in_RCX;
  char in_DL;
  MACROBLOCKD *in_RSI;
  AV1_COMMON *in_RDI;
  uint8_t *in_R8;
  byte in_R9B;
  int in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  int_mv (*in_stack_00000018) [2];
  int_mv *in_stack_00000020;
  int16_t *in_stack_00000028;
  scale_factors *sf;
  int num_planes;
  YV12_BUFFER_CONFIG *yv12;
  YV12_BUFFER_CONFIG *scaled_ref;
  _Bool ref_is_scaled;
  YV12_BUFFER_CONFIG *ref;
  MB_MODE_INFO_EXT *mbmi_ext;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  MACROBLOCKD *in_stack_ffffffffffffff38;
  AV1_COMMON *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  AV1_COMP *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  int_mv *piVar4;
  int_mv *nearest_mv;
  MV_REFERENCE_FRAME ref_frame_00;
  int_mv *mbmi_ext_00;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint ref_y_stride;
  MACROBLOCK *x_00;
  AV1_COMP *cpi_00;
  MACROBLOCKD *xd_00;
  AV1_COMMON *cm_00;
  undefined7 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffe0;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  cm_00 = (AV1_COMMON *)(in_RDI[9].quant_params.y_iqmatrix + 5);
  xd_00 = (MACROBLOCKD *)(in_RSI->plane[0].seg_iqmatrix[1] + 9);
  cpi_00 = (AV1_COMP *)**(undefined8 **)(in_RSI->sgrproj_info[0].xqd + 1);
  x_00 = (MACROBLOCK *)(in_RSI[1].plane[0].seg_iqmatrix[1] + 9);
  ref_y_buffer = (int_mv *)
                 get_ref_frame_yv12_buf
                           ((AV1_COMMON *)in_stack_ffffffffffffff50,
                            (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffff48 >> 0x38));
  ref_frame_00 = true;
  if (ref_y_buffer[6].as_int == cm_00->height) {
    ref_frame_00 = ref_y_buffer[4].as_int != cm_00->width;
  }
  ref_y_stride = CONCAT13(ref_frame_00,(int3)in_stack_ffffffffffffff9c);
  piVar3 = (int_mv *)av1_get_scaled_ref_frame(in_stack_ffffffffffffff50,iVar2);
  piVar4 = ref_y_buffer;
  if (((ref_y_stride & 0x1000000) != 0) && (piVar3 != (int_mv *)0x0)) {
    piVar4 = piVar3;
  }
  nearest_mv = piVar4;
  iVar2 = av1_num_planes(cm_00);
  piVar1 = in_RSI[5].cfl.ac_buf_q3 + (long)in_DL * 2 + 0x2a4;
  piVar1[0] = -1;
  piVar1[1] = 0x7fff;
  piVar1 = in_RSI[5].cfl.ac_buf_q3 + (long)in_DL * 2 + 0x2b8;
  piVar1[0] = -1;
  piVar1[1] = 0x7fff;
  piVar1 = in_RSI[5].cfl.ac_buf_q3 + (long)in_DL * 2 + 0x2c8;
  piVar1[0] = -1;
  piVar1[1] = 0x7fff;
  *(undefined4 *)(in_RCX + 0x200 + (long)in_DL * 4) = 0x80008000;
  if (piVar4 != (int_mv *)0x0) {
    if (piVar3 == (int_mv *)0x0) {
      piVar4 = (int_mv *)
               get_ref_scale_factors
                         (in_stack_ffffffffffffff40,
                          (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffff38 >> 0x38));
    }
    else {
      piVar4 = (int_mv *)0x0;
    }
    mbmi_ext_00 = piVar4;
    av1_setup_pred_block
              ((MACROBLOCKD *)CONCAT17(in_R9B,in_stack_ffffffffffffffc8),(buf_2d *)cm_00,
               (YV12_BUFFER_CONFIG *)xd_00,(scale_factors *)cpi_00,(scale_factors *)x_00,
               (int)((ulong)ref_y_buffer >> 0x20));
    in_stack_ffffffffffffff38 = (MACROBLOCKD *)xd_00->weight;
    in_stack_ffffffffffffff40 = (AV1_COMMON *)0x0;
    av1_find_mv_refs(in_RDI,in_RSI,(MB_MODE_INFO *)CONCAT17(in_DL,in_stack_ffffffffffffffe0),
                     (MV_REFERENCE_FRAME)((ulong)in_RCX >> 0x38),in_R8,
                     (CANDIDATE_MV (*) [8])CONCAT17(in_R9B,in_stack_ffffffffffffffc8),
                     (uint16_t (*) [8])CONCAT44(in_stack_00000014,in_stack_00000010),
                     in_stack_00000018,in_stack_00000020,in_stack_00000028);
    av1_copy_usable_ref_mv_stack_and_weight(xd_00,(MB_MODE_INFO_EXT *)x_00,in_DL);
    av1_find_best_ref_mvs_from_stack
              (iVar2,(MB_MODE_INFO_EXT *)&mbmi_ext_00->as_mv,ref_frame_00,nearest_mv,piVar4,
               in_stack_ffffffffffffff5c);
    *(undefined4 *)(in_RCX + 0x1e0 + (long)in_DL * 4) =
         *(undefined4 *)((long)(x_00->e_mbd).plane[0].seg_iqmatrix[3] + (long)in_DL * 4 + 0x80);
    if (((((ref_y_stride & 0x1000000) == 0) && (2 < in_R9B)) && (in_stack_00000010 == 0)) &&
       ((in_stack_00000008 == 0 || (in_DL == '\x01')))) {
      av1_mv_pred(cpi_00,x_00,(uint8_t *)&ref_y_buffer->as_int,ref_y_stride,
                  in_stack_ffffffffffffff98,(BLOCK_SIZE)((ulong)piVar3 >> 0x38));
    }
  }
  if (((cm_00->features).switchable_motion_mode & 1U) != 0) {
    av1_count_overlappable_neighbors(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  *(undefined1 *)((long)(cpi_00->enc_quant_dequant_params).quants.y_quant[0] + 9) = 1;
  *(bool *)*in_stack_00000018 = (ref_y_stride & 0x1000000) != 0 && piVar3 != (int_mv *)0x0;
  return;
}

Assistant:

static inline void find_predictors(
    AV1_COMP *cpi, MACROBLOCK *x, MV_REFERENCE_FRAME ref_frame,
    int_mv frame_mv[MB_MODE_COUNT][REF_FRAMES],
    struct buf_2d yv12_mb[8][MAX_MB_PLANE], BLOCK_SIZE bsize,
    int force_skip_low_temp_var, int skip_pred_mv, bool *use_scaled_ref_frame) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  const YV12_BUFFER_CONFIG *ref = get_ref_frame_yv12_buf(cm, ref_frame);
  const bool ref_is_scaled =
      ref->y_crop_height != cm->height || ref->y_crop_width != cm->width;
  const YV12_BUFFER_CONFIG *scaled_ref =
      av1_get_scaled_ref_frame(cpi, ref_frame);
  const YV12_BUFFER_CONFIG *yv12 =
      ref_is_scaled && scaled_ref ? scaled_ref : ref;
  const int num_planes = av1_num_planes(cm);
  x->pred_mv_sad[ref_frame] = INT_MAX;
  x->pred_mv0_sad[ref_frame] = INT_MAX;
  x->pred_mv1_sad[ref_frame] = INT_MAX;
  frame_mv[NEWMV][ref_frame].as_int = INVALID_MV;
  // TODO(kyslov) this needs various further optimizations. to be continued..
  assert(yv12 != NULL);
  if (yv12 != NULL) {
    struct scale_factors *const sf =
        scaled_ref ? NULL : get_ref_scale_factors(cm, ref_frame);
    av1_setup_pred_block(xd, yv12_mb[ref_frame], yv12, sf, sf, num_planes);
    av1_find_mv_refs(cm, xd, mbmi, ref_frame, mbmi_ext->ref_mv_count,
                     xd->ref_mv_stack, xd->weight, NULL, mbmi_ext->global_mvs,
                     mbmi_ext->mode_context);
    // TODO(Ravi): Populate mbmi_ext->ref_mv_stack[ref_frame][4] and
    // mbmi_ext->weight[ref_frame][4] inside av1_find_mv_refs.
    av1_copy_usable_ref_mv_stack_and_weight(xd, mbmi_ext, ref_frame);
    av1_find_best_ref_mvs_from_stack(
        cm->features.allow_high_precision_mv, mbmi_ext, ref_frame,
        &frame_mv[NEARESTMV][ref_frame], &frame_mv[NEARMV][ref_frame], 0);
    frame_mv[GLOBALMV][ref_frame] = mbmi_ext->global_mvs[ref_frame];
    // Early exit for non-LAST frame if force_skip_low_temp_var is set.
    if (!ref_is_scaled && bsize >= BLOCK_8X8 && !skip_pred_mv &&
        !(force_skip_low_temp_var && ref_frame != LAST_FRAME)) {
      av1_mv_pred(cpi, x, yv12_mb[ref_frame][0].buf, yv12->y_stride, ref_frame,
                  bsize);
    }
  }
  if (cm->features.switchable_motion_mode) {
    av1_count_overlappable_neighbors(cm, xd);
  }
  mbmi->num_proj_ref = 1;
  *use_scaled_ref_frame = ref_is_scaled && scaled_ref;
}